

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

int __thiscall StringBTree::lessThanKeyCompareOp(StringBTree *this,KeyType *key,uint8_t *data)

{
  uint8_t *in_RDI;
  KeyType *unaff_retaddr;
  StringBTree *in_stack_00000008;
  int result;
  uint32_t unk;
  int local_2c;
  uint8_t *local_18 [2];
  
  decodeBitsAndAdvance(local_18);
  local_2c = equalKeyCompareOp(in_stack_00000008,unaff_retaddr,in_RDI);
  if (local_2c == 0) {
    local_2c = 1;
  }
  return local_2c;
}

Assistant:

int lessThanKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		// TODO: figure out
		const auto unk = static_cast<uint32_t>(decodeBitsAndAdvance(data));

		const auto result = equalKeyCompareOp(key, data);
		
		return (result != 0) ? result : 1;
	}